

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Gecko::Graph::vcycle(Graph *this,uint n,uint work)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Graph *this_00;
  uint n_00;
  
  uVar1 = (int)((ulong)((long)(this->node).
                              super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->node).
                             super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 4) - 1;
  if (((n < uVar1) &&
      (uVar1 < (uint)(((ulong)((long)(this->adj).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->adj).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >>
                     1))) && (this->level != 0)) {
    iVar2 = (*this->progress->_vptr_Progress[8])();
    if ((char)iVar2 == '\0') {
      this_00 = coarsen(this);
      vcycle(this_00,n,
             (int)(((ulong)((long)(this->adj).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->adj).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >> 1)
             + work);
      refine(this,this_00);
      ~Graph(this_00);
      operator_delete(this_00);
      goto LAB_0010c4f3;
    }
  }
  place(this,false);
LAB_0010c4f3:
  if ((((ulong)((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff & 0x1fffffffe) !=
      0) {
    relax(this,true,1);
    relax(this,false,1);
    uVar4 = ((ulong)((long)(this->adj).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->adj).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >> 1;
    uVar1 = n - 1;
    do {
      uVar3 = (int)uVar4 * (uVar1 + 2);
      uVar4 = (ulong)uVar3;
      uVar1 = uVar1 + 1;
    } while (uVar3 < work);
    if (uVar1 != 0) {
      n_00 = 0x10;
      if (uVar1 < 0x10) {
        n_00 = uVar1;
      }
      optimize(this,n_00);
      return;
    }
  }
  return;
}

Assistant:

void
Graph::vcycle(uint n, uint work)
{
  if (n < nodes() && nodes() < edges() && level && !progress->quit()) {
    Graph* graph = coarsen();
    graph->vcycle(n, work + edges());
    refine(graph);
    delete graph;
  }
  else
    place();
  if (edges()) {
    relax(true, GECKO_CR_SWEEPS);
    relax(false, GECKO_GS_SWEEPS);
    for (uint w = edges(); w * (n + 1) < work; w *= ++n);
    n = std::min(n, uint(GECKO_WINDOW_MAX));
    if (n)
      optimize(n);
  }
}